

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

int32 ngram_score_to_prob(ngram_model_t *base,int32 score)

{
  return (int)((float)(score - base->log_wip) / (float)base->lw);
}

Assistant:

int32
ngram_score_to_prob(ngram_model_t * base, int32 score)
{
    int32 prob;

    /* Undo insertion penalty. */
    prob = score - base->log_wip;
    /* Undo language weight. */
    prob = (int32) (prob / base->lw);

    return prob;
}